

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O1

bool DoGroupForOne(AActor *victim,AActor *source,AActor *dest,bool floorz,bool fog)

{
  double dVar1;
  double dVar2;
  double __x;
  double __x_00;
  double __x_01;
  double dVar3;
  bool bVar4;
  undefined7 in_register_00000009;
  double dVar5;
  double dVar6;
  DAngle local_50;
  DVector3 local_48;
  
  dVar5 = (victim->__Pos).X;
  dVar6 = (victim->__Pos).Y;
  dVar1 = (source->__Pos).X;
  dVar2 = (source->__Pos).Y;
  __x = FFastTrig::cos(&fasttrig,
                       ((dest->Angles).Yaw.Degrees - (source->Angles).Yaw.Degrees) *
                       11930464.711111112 + 6755399441055744.0);
  __x_00 = FFastTrig::sin(&fasttrig,__x);
  __x_01 = FFastTrig::sin(&fasttrig,__x_00);
  dVar3 = FFastTrig::cos(&fasttrig,__x_01);
  if ((int)CONCAT71(in_register_00000009,floorz) == 0) {
    local_48.Z = ((dest->__Pos).Z + (victim->__Pos).Z) - (source->__Pos).Z;
  }
  else {
    local_48.Z = -2147483648.0;
  }
  dVar5 = dVar5 - dVar1;
  dVar6 = dVar6 - dVar2;
  local_48.X = (dVar5 * __x - dVar6 * __x_00) + (dest->__Pos).X;
  local_48.Y = dVar3 * dVar6 + __x_01 * dVar5 + (dest->__Pos).Y;
  local_50.Degrees = 0.0;
  bVar4 = P_Teleport(victim,&local_48,&local_50,4 - (uint)fog);
  (victim->Angles).Yaw.Degrees =
       (double)((ulong)((((victim->Angles).Yaw.Degrees + (dest->Angles).Yaw.Degrees) -
                        (source->Angles).Yaw.Degrees) * 11930464.711111112 + 6755399441055744.0) &
               0xffffffff) * 8.381903171539307e-08;
  return bVar4;
}

Assistant:

static bool DoGroupForOne (AActor *victim, AActor *source, AActor *dest, bool floorz, bool fog)
{
	DAngle an = dest->Angles.Yaw - source->Angles.Yaw;
	DVector2 off = victim->Pos() - source->Pos();
	DAngle offAngle = victim->Angles.Yaw - source->Angles.Yaw;
	DVector2 newp = { off.X * an.Cos() - off.Y * an.Sin(), off.X * an.Sin() + off.Y * an.Cos() };
	double z = floorz ? ONFLOORZ : dest->Z() + victim->Z() - source->Z();

	bool res =
		P_Teleport (victim, DVector3(dest->Pos().XY() + newp, z),
							0., fog ? (TELF_DESTFOG | TELF_SOURCEFOG) : TELF_KEEPORIENTATION);
	// P_Teleport only changes angle if fog is true
	victim->Angles.Yaw = (dest->Angles.Yaw + victim->Angles.Yaw - source->Angles.Yaw).Normalized360();

	return res;
}